

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.c
# Opt level: O0

int X509_NAME_add_entry(X509_NAME *name,X509_NAME_ENTRY *ne,int loc,int set)

{
  int iVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  X509_NAME_ENTRY *a;
  void *pvVar4;
  stack_st_X509_NAME_ENTRY *sk;
  int inc;
  int i;
  int n;
  X509_NAME_ENTRY *new_name;
  stack_st_X509_NAME_ENTRY *sk_00;
  undefined4 in_stack_ffffffffffffffc8;
  uint line;
  undefined4 in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  
  if (name != (X509_NAME *)0x0) {
    sk_00 = (stack_st_X509_NAME_ENTRY *)name->entries;
    pOVar3 = ossl_check_const_X509_NAME_ENTRY_sk_type(sk_00);
    iVar1 = OPENSSL_sk_num(pOVar3);
    local_1c = iVar1;
    if ((loc <= iVar1) && (local_1c = loc, loc < 0)) {
      local_1c = iVar1;
    }
    line = (uint)(set == 0);
    name->modified = 1;
    if (set == -1) {
      if (local_1c == 0) {
        local_20 = 0;
        line = 1;
      }
      else {
        pOVar3 = ossl_check_const_X509_NAME_ENTRY_sk_type(sk_00);
        pvVar4 = OPENSSL_sk_value(pOVar3,local_1c + -1);
        local_20 = *(int *)((long)pvVar4 + 0x10);
      }
    }
    else if (local_1c < iVar1) {
      pOVar3 = ossl_check_const_X509_NAME_ENTRY_sk_type(sk_00);
      pvVar4 = OPENSSL_sk_value(pOVar3,local_1c);
      local_20 = *(int *)((long)pvVar4 + 0x10);
    }
    else if (local_1c == 0) {
      local_20 = 0;
    }
    else {
      pOVar3 = ossl_check_const_X509_NAME_ENTRY_sk_type(sk_00);
      pvVar4 = OPENSSL_sk_value(pOVar3,local_1c + -1);
      local_20 = *(int *)((long)pvVar4 + 0x10) + 1;
    }
    a = X509_NAME_ENTRY_dup(ne);
    if (a != (X509_NAME_ENTRY *)0x0) {
      a->set = local_20;
      pOVar3 = ossl_check_X509_NAME_ENTRY_sk_type(sk_00);
      iVar2 = (int)((ulong)pOVar3 >> 0x20);
      ossl_check_X509_NAME_ENTRY_type((X509_NAME_ENTRY *)a);
      iVar2 = OPENSSL_sk_insert((OPENSSL_STACK *)CONCAT44(line,in_stack_ffffffffffffffc8),sk_00,
                                iVar2);
      if (iVar2 != 0) {
        if (line != 0) {
          pOVar3 = ossl_check_const_X509_NAME_ENTRY_sk_type(sk_00);
          iVar1 = OPENSSL_sk_num(pOVar3);
          while (local_1c = local_1c + 1, local_1c < iVar1) {
            pOVar3 = ossl_check_const_X509_NAME_ENTRY_sk_type(sk_00);
            pvVar4 = OPENSSL_sk_value(pOVar3,local_1c);
            *(int *)((long)pvVar4 + 0x10) = *(int *)((long)pvVar4 + 0x10) + 1;
          }
        }
        return 1;
      }
      ERR_new();
      ERR_set_debug((char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),line,(char *)sk_00);
      ERR_set_error(0xb,0xc0100,(char *)0x0);
    }
    X509_NAME_ENTRY_free(a);
  }
  return 0;
}

Assistant:

int X509_NAME_add_entry(X509_NAME *name, const X509_NAME_ENTRY *ne, int loc,
                        int set)
{
    X509_NAME_ENTRY *new_name = NULL;
    int n, i, inc;
    STACK_OF(X509_NAME_ENTRY) *sk;

    if (name == NULL)
        return 0;
    sk = name->entries;
    n = sk_X509_NAME_ENTRY_num(sk);
    if (loc > n)
        loc = n;
    else if (loc < 0)
        loc = n;
    inc = (set == 0);
    name->modified = 1;

    if (set == -1) {
        if (loc == 0) {
            set = 0;
            inc = 1;
        } else {
            set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
        }
    } else {                    /* if (set >= 0) */

        if (loc >= n) {
            if (loc != 0)
                set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set + 1;
            else
                set = 0;
        } else
            set = sk_X509_NAME_ENTRY_value(sk, loc)->set;
    }

    if ((new_name = X509_NAME_ENTRY_dup(ne)) == NULL)
        goto err;
    new_name->set = set;
    if (!sk_X509_NAME_ENTRY_insert(sk, new_name, loc)) {
        ERR_raise(ERR_LIB_X509, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    if (inc) {
        n = sk_X509_NAME_ENTRY_num(sk);
        for (i = loc + 1; i < n; i++)
            sk_X509_NAME_ENTRY_value(sk, i)->set += 1;
    }
    return 1;
 err:
    X509_NAME_ENTRY_free(new_name);
    return 0;
}